

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O0

void __thiscall
hanabi_learning_env::HanabiState::HanabiDeck::HanabiDeck(HanabiDeck *this,HanabiGame *game)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  HanabiGame *in_RSI;
  HanabiDeck *in_RDI;
  int count;
  int rank;
  int color;
  allocator_type *in_stack_ffffffffffffff78;
  HanabiDeck *this_00;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_2c;
  int local_28;
  
  HanabiGame::NumColors(in_RSI);
  HanabiGame::NumRanks(in_RSI);
  std::allocator<int>::allocator((allocator<int> *)0x150104);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (value_type *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  std::allocator<int>::~allocator((allocator<int> *)0x15012f);
  in_RDI->total_count_ = 0;
  iVar1 = HanabiGame::NumRanks(in_RSI);
  in_RDI->num_ranks_ = iVar1;
  local_28 = 0;
  while( true ) {
    iVar1 = local_28;
    iVar2 = HanabiGame::NumColors(in_RSI);
    if (iVar2 <= iVar1) break;
    local_2c = 0;
    while( true ) {
      iVar1 = local_2c;
      iVar2 = HanabiGame::NumRanks(in_RSI);
      if (iVar2 <= iVar1) break;
      iVar1 = HanabiGame::NumberCardInstances
                        ((HanabiGame *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffff84,
                         in_stack_ffffffffffffff80);
      this_00 = in_RDI;
      in_stack_ffffffffffffff84 = iVar1;
      in_stack_ffffffffffffff80 = CardToIndex(in_RDI,local_28,local_2c);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this_00->card_count_,(long)in_stack_ffffffffffffff80);
      *pvVar3 = iVar1;
      in_RDI->total_count_ = iVar1 + in_RDI->total_count_;
      local_2c = local_2c + 1;
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

HanabiState::HanabiDeck::HanabiDeck(const HanabiGame& game)
    : card_count_(game.NumColors() * game.NumRanks(), 0),
      total_count_(0),
      num_ranks_(game.NumRanks()) {
  for (int color = 0; color < game.NumColors(); ++color) {
    for (int rank = 0; rank < game.NumRanks(); ++rank) {
      auto count = game.NumberCardInstances(color, rank);
      card_count_[CardToIndex(color, rank)] = count;
      total_count_ += count;
    }
  }
}